

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O1

raw_ostream * __thiscall
llvm::raw_ostream::write_escaped(raw_ostream *this,StringRef Str,bool UseHexEscapes)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  uint __fd;
  raw_ostream *prVar4;
  raw_ostream *this_00;
  byte *pbVar5;
  undefined7 in_register_00000009;
  byte *pbVar6;
  byte *pbVar7;
  byte *extraout_RDX;
  byte *extraout_RDX_00;
  byte *extraout_RDX_01;
  byte *extraout_RDX_02;
  byte *extraout_RDX_03;
  byte *extraout_RDX_04;
  byte *extraout_RDX_05;
  byte *extraout_RDX_06;
  byte *extraout_RDX_07;
  byte *extraout_RDX_08;
  byte *pbVar8;
  byte *pbVar9;
  uchar UC;
  byte bVar10;
  uint __fd_00;
  
  pbVar6 = (byte *)CONCAT71(in_register_00000009,UseHexEscapes);
  pbVar7 = (byte *)Str.Length;
  if (pbVar7 != (byte *)0x0) {
    pbVar9 = (byte *)0x0;
    pbVar8 = pbVar7;
    do {
      bVar10 = Str.Data[(long)pbVar9];
      prVar4 = this;
      if (bVar10 < 0x22) {
        if (bVar10 == 9) {
          pcVar1 = this->OutBufCur;
          if (pcVar1 < this->OutBufEnd) {
            this->OutBufCur = pcVar1 + 1;
            *pcVar1 = '\\';
          }
          else {
            prVar4 = (raw_ostream *)write(this,0x5c,pbVar8,(size_t)pbVar6);
            pbVar8 = extraout_RDX_01;
          }
          pbVar6 = (byte *)prVar4->OutBufCur;
          if (pbVar6 < prVar4->OutBufEnd) {
            pbVar8 = pbVar6 + 1;
            prVar4->OutBufCur = (char *)pbVar8;
            *pbVar6 = 0x74;
            goto LAB_00db47db;
          }
          __fd_00 = 0x74;
        }
        else if (bVar10 == 10) {
          pcVar1 = this->OutBufCur;
          if (pcVar1 < this->OutBufEnd) {
            this->OutBufCur = pcVar1 + 1;
            *pcVar1 = '\\';
          }
          else {
            prVar4 = (raw_ostream *)write(this,0x5c,pbVar8,(size_t)pbVar6);
            pbVar8 = extraout_RDX;
          }
          pbVar6 = (byte *)prVar4->OutBufCur;
          if (pbVar6 < prVar4->OutBufEnd) {
            pbVar8 = pbVar6 + 1;
            prVar4->OutBufCur = (char *)pbVar8;
            *pbVar6 = 0x6e;
            goto LAB_00db47db;
          }
          __fd_00 = 0x6e;
        }
        else {
LAB_00db453b:
          __fd_00 = (uint)bVar10;
          if ((byte)(bVar10 - 0x20) < 0x5f) {
            pbVar5 = (byte *)this->OutBufCur;
            if (pbVar5 < this->OutBufEnd) {
LAB_00db47bd:
              pbVar6 = pbVar5 + 1;
              this->OutBufCur = (char *)pbVar6;
              *pbVar5 = bVar10;
              goto LAB_00db47db;
            }
          }
          else {
            if (UseHexEscapes) {
              pcVar1 = this->OutBufCur;
              if (pcVar1 < this->OutBufEnd) {
                this->OutBufCur = pcVar1 + 1;
                *pcVar1 = '\\';
                this_00 = this;
              }
              else {
                this_00 = (raw_ostream *)write(this,0x5c,pbVar8,(size_t)pbVar6);
                pbVar8 = extraout_RDX_03;
              }
              pcVar1 = this_00->OutBufCur;
              if (pcVar1 < this_00->OutBufEnd) {
                this_00->OutBufCur = pcVar1 + 1;
                *pcVar1 = 'x';
              }
              else {
                write(this_00,0x78,pbVar8,(size_t)pcVar1);
              }
              bVar3 = bVar10 >> 4 | 0x30;
              __fd = (bVar10 >> 4) + 0x37;
              if (bVar10 < 0xa0) {
                __fd = (uint)bVar3;
              }
              pcVar1 = this->OutBufCur;
              if (pcVar1 < this->OutBufEnd) {
                pbVar8 = (byte *)(pcVar1 + 1);
                this->OutBufCur = (char *)pbVar8;
                *pcVar1 = (char)__fd;
              }
              else {
                write(this,__fd,(void *)(ulong)bVar3,(size_t)pcVar1);
                pbVar8 = extraout_RDX_06;
              }
              cVar2 = (char)(__fd_00 & 0xf);
              bVar10 = cVar2 + 0x37;
              if ((__fd_00 & 0xf) < 10) {
                bVar10 = cVar2 + 0x30;
              }
              pbVar6 = (byte *)this->OutBufCur;
              if (pbVar6 < this->OutBufEnd) {
                pbVar8 = pbVar6 + 1;
                this->OutBufCur = (char *)pbVar8;
                *pbVar6 = bVar10;
                goto LAB_00db47db;
              }
            }
            else {
              pcVar1 = this->OutBufCur;
              if (pcVar1 < this->OutBufEnd) {
                this->OutBufCur = pcVar1 + 1;
                *pcVar1 = '\\';
              }
              else {
                write(this,0x5c,pbVar8,(size_t)pbVar6);
                pbVar8 = extraout_RDX_04;
              }
              bVar3 = bVar10 >> 6 | 0x30;
              pbVar6 = (byte *)this->OutBufCur;
              if (pbVar6 < this->OutBufEnd) {
                pbVar8 = pbVar6 + 1;
                this->OutBufCur = (char *)pbVar8;
                *pbVar6 = bVar3;
              }
              else {
                write(this,(uint)bVar3,pbVar8,(size_t)pbVar6);
                pbVar8 = extraout_RDX_05;
              }
              bVar3 = bVar10 >> 3 & 7 | 0x30;
              pbVar6 = (byte *)this->OutBufCur;
              if (pbVar6 < this->OutBufEnd) {
                pbVar8 = pbVar6 + 1;
                this->OutBufCur = (char *)pbVar8;
                *pbVar6 = bVar3;
              }
              else {
                write(this,(uint)bVar3,pbVar8,(size_t)pbVar6);
                pbVar8 = extraout_RDX_07;
              }
              bVar10 = bVar10 & 7 | 0x30;
              pbVar5 = (byte *)this->OutBufCur;
              if (pbVar5 < this->OutBufEnd) goto LAB_00db47bd;
            }
            __fd_00 = (uint)bVar10;
          }
        }
LAB_00db47d6:
        write(prVar4,__fd_00,pbVar8,(size_t)pbVar6);
        pbVar8 = extraout_RDX_08;
      }
      else if (bVar10 == 0x22) {
        pcVar1 = this->OutBufCur;
        if (pcVar1 < this->OutBufEnd) {
          this->OutBufCur = pcVar1 + 1;
          *pcVar1 = '\\';
        }
        else {
          prVar4 = (raw_ostream *)write(this,0x5c,pbVar8,(size_t)pbVar6);
          pbVar8 = extraout_RDX_02;
        }
        pbVar6 = (byte *)prVar4->OutBufCur;
        if (prVar4->OutBufEnd <= pbVar6) {
          __fd_00 = 0x22;
          goto LAB_00db47d6;
        }
        pbVar8 = pbVar6 + 1;
        prVar4->OutBufCur = (char *)pbVar8;
        *pbVar6 = 0x22;
      }
      else {
        if (bVar10 != 0x5c) goto LAB_00db453b;
        pcVar1 = this->OutBufCur;
        if (pcVar1 < this->OutBufEnd) {
          this->OutBufCur = pcVar1 + 1;
          *pcVar1 = '\\';
        }
        else {
          prVar4 = (raw_ostream *)write(this,0x5c,pbVar8,(size_t)pbVar6);
          pbVar8 = extraout_RDX_00;
        }
        pbVar6 = (byte *)prVar4->OutBufCur;
        if (prVar4->OutBufEnd <= pbVar6) {
          __fd_00 = 0x5c;
          goto LAB_00db47d6;
        }
        pbVar8 = pbVar6 + 1;
        prVar4->OutBufCur = (char *)pbVar8;
        *pbVar6 = 0x5c;
      }
LAB_00db47db:
      pbVar9 = pbVar9 + 1;
    } while (pbVar7 != pbVar9);
  }
  return this;
}

Assistant:

raw_ostream &raw_ostream::write_escaped(StringRef Str,
                                        bool UseHexEscapes) {
  for (unsigned char c : Str) {
    switch (c) {
    case '\\':
      *this << '\\' << '\\';
      break;
    case '\t':
      *this << '\\' << 't';
      break;
    case '\n':
      *this << '\\' << 'n';
      break;
    case '"':
      *this << '\\' << '"';
      break;
    default:
      if (isPrint(c)) {
        *this << c;
        break;
      }

      // Write out the escaped representation.
      if (UseHexEscapes) {
        *this << '\\' << 'x';
        *this << hexdigit((c >> 4 & 0xF));
        *this << hexdigit((c >> 0) & 0xF);
      } else {
        // Always use a full 3-character octal escape.
        *this << '\\';
        *this << char('0' + ((c >> 6) & 7));
        *this << char('0' + ((c >> 3) & 7));
        *this << char('0' + ((c >> 0) & 7));
      }
    }
  }

  return *this;
}